

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O2

string * YAML::ErrorMsg::BAD_SUBSCRIPT_WITH_KEY(string *__return_storage_ptr__,string *key)

{
  ostream *poVar1;
  stringstream stream;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"operator[] call on a scalar");
  poVar1 = std::operator<<(poVar1," (key: \"");
  poVar1 = std::operator<<(poVar1,(string *)key);
  std::operator<<(poVar1,"\")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

inline const std::string BAD_SUBSCRIPT_WITH_KEY(const std::string& key) {
  std::stringstream stream;
  stream << BAD_SUBSCRIPT << " (key: \"" << key << "\")";
  return stream.str();
}